

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O0

Rsb_Man_t * Rsb_ManAlloc(int nLeafMax,int nDivMax,int nDecMax,int fVerbose)

{
  int nCap;
  Rsb_Man_t *pRVar1;
  Vec_Wrd_t *pVVar2;
  Vec_Int_t *pVVar3;
  Rsb_Man_t *p;
  int fVerbose_local;
  int nDecMax_local;
  int nDivMax_local;
  int nLeafMax_local;
  
  if (0x14 < nLeafMax) {
    __assert_fail("nLeafMax <= 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbMan.c"
                  ,0x30,"Rsb_Man_t *Rsb_ManAlloc(int, int, int, int)");
  }
  if (nDivMax < 0xc9) {
    pRVar1 = (Rsb_Man_t *)calloc(1,0x38);
    pRVar1->nLeafMax = nLeafMax;
    pRVar1->nDivMax = nDivMax;
    pRVar1->nDecMax = nDecMax;
    pRVar1->fVerbose = fVerbose;
    pVVar2 = Vec_WrdAlloc(nDivMax + 0x96);
    pRVar1->vCexes = pVVar2;
    nCap = Abc_TtWordNum(nLeafMax);
    pVVar3 = Vec_IntAlloc(nCap);
    pRVar1->vDecPats = pVVar3;
    pVVar3 = Vec_IntAlloc(10);
    pRVar1->vFanins = pVVar3;
    pVVar3 = Vec_IntAlloc(10);
    pRVar1->vFaninsOld = pVVar3;
    pVVar3 = Vec_IntAlloc(10);
    pRVar1->vTries = pVVar3;
    return pRVar1;
  }
  __assert_fail("nDivMax <= 200",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbMan.c"
                ,0x31,"Rsb_Man_t *Rsb_ManAlloc(int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rsb_Man_t * Rsb_ManAlloc( int nLeafMax, int nDivMax, int nDecMax, int fVerbose )
{
    Rsb_Man_t * p;
    assert( nLeafMax <= 20 );
    assert( nDivMax  <= 200 );
    p = ABC_CALLOC( Rsb_Man_t, 1 );
    p->nLeafMax   = nLeafMax;
    p->nDivMax    = nDivMax;
    p->nDecMax    = nDecMax;
    p->fVerbose   = fVerbose;
    // decomposition
    p->vCexes     = Vec_WrdAlloc( nDivMax + 150 );
    p->vDecPats   = Vec_IntAlloc( Abc_TtWordNum(nLeafMax) );
    p->vFanins    = Vec_IntAlloc( 10 );
    p->vFaninsOld = Vec_IntAlloc( 10 );
    p->vTries     = Vec_IntAlloc( 10 );
    return p;
}